

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O2

void calc_similarity_internal<float,unsigned_long,double>
               (float *numeric_data,int *categ_data,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,size_t nrows,int nthreads,bool assume_full_distr,
               bool standardize_dist,bool as_kernel,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *tmat,double *rmat,size_t n_from,
               bool use_indexed_references,TreesIndexer *indexer,bool is_col_major,size_t ld_numeric
               ,size_t ld_categ)

{
  pointer pSVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  size_t ntrees;
  size_t n_from_00;
  runtime_error *this;
  ExtIsoForest *pEVar5;
  byte bVar6;
  size_t sVar7;
  bool bVar8;
  exception_ptr ex;
  SignalSwitcher ss;
  vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> worker_memory;
  PredictionData<float,_unsigned_long> local_90;
  
  if ((nrows < 2) &&
     ((((indexer == (TreesIndexer *)0x0 || (!use_indexed_references)) ||
       (pSVar1 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pSVar1 == (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish)) ||
      ((pSVar1->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (pSVar1->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish)))) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Cannot calculate distances from less than 2 rows.\n");
    goto LAB_002ddc36;
  }
  if ((!as_kernel) ||
     ((indexer != (TreesIndexer *)0x0 && (use_indexed_references && tmat == (double *)0x0) &&
      ((pSVar1 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pSVar1 == (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish ||
       ((pSVar1->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pSVar1->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish)))))) {
    if (model_outputs != (IsoForest *)0x0 && indexer != (TreesIndexer *)0x0) {
      bVar8 = model_outputs->missing_action == Divide;
      if (bVar8) {
        indexer = (TreesIndexer *)0x0;
      }
      if (bVar8 && use_indexed_references) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Invalid indexer - cannot use references from it.\n")
        ;
        goto LAB_002ddc36;
      }
      if (model_outputs->new_cat_action == Weighted) {
        bVar8 = model_outputs->cat_split_type == SubSet;
        if (categ_data != (int *)0x0 && bVar8) {
          indexer = (TreesIndexer *)0x0;
        }
        if ((categ_data != (int *)0x0 && bVar8) && use_indexed_references) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this,"Invalid indexer - cannot use references from it.\n");
          goto LAB_002ddc36;
        }
      }
    }
    if (indexer == (TreesIndexer *)0x0 || as_kernel) goto LAB_002dd6a8;
    pSVar1 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar1 == (indexer->indices).
                  super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
LAB_002ddbc9:
      fputs("Indexer has no pre-computed distances, will not be used for distance calculations.\n",
            _stderr);
      indexer = (TreesIndexer *)0x0;
      goto LAB_002dd6a8;
    }
    if ((pSVar1->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pSVar1->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((use_indexed_references) &&
         ((pSVar1->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pSVar1->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"Indexer was built without distances. Cannot use references from it.\n");
        goto LAB_002ddc36;
      }
      goto LAB_002ddbc9;
    }
LAB_002dd751:
    if (((use_indexed_references && tmat == (double *)0x0) &&
        (pSVar1 = (indexer->indices).
                  super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                  super__Vector_impl_data._M_start,
        pSVar1 != (indexer->indices).
                  super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                  super__Vector_impl_data._M_finish)) &&
       ((pSVar1->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pSVar1->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      if (assume_full_distr) {
        if (as_kernel) {
          kernel_to_references<float,unsigned_long>
                    (indexer,model_outputs,model_outputs_ext,numeric_data,categ_data,Xc,Xc_ind,
                     Xc_indptr,is_col_major,ld_numeric,ld_categ,nrows,nthreads,rmat,standardize_dist
                    );
          return;
        }
        calc_similarity_from_indexer_with_references<float,unsigned_long>
                  (numeric_data,categ_data,Xc,Xc_ind,Xc_indptr,nrows,nthreads,standardize_dist,
                   model_outputs,model_outputs_ext,rmat,indexer,is_col_major,ld_numeric,ld_categ);
        return;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "Cannot calculate distances to reference points in indexer with \'assume_full_distr=false\'.\n"
                );
      goto LAB_002ddc36;
    }
    bVar6 = 1;
    if (!as_kernel) {
      calc_similarity_from_indexer<float,unsigned_long>
                (numeric_data,categ_data,Xc,Xc_ind,Xc_indptr,nrows,nthreads,assume_full_distr,
                 standardize_dist,model_outputs,model_outputs_ext,tmat,rmat,n_from,indexer,
                 is_col_major,ld_numeric,ld_categ);
      return;
    }
  }
  else {
    indexer = (TreesIndexer *)0x0;
LAB_002dd6a8:
    if (indexer == (TreesIndexer *)0x0 && !is_col_major) {
      if ((Xc_indptr != (unsigned_long *)0x0) ||
         ((nrows != 1 &&
          ((numeric_data != (float *)0x0 && 1 < ld_numeric ||
           (1 < ld_categ && categ_data != (int *)0x0)))))) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"Cannot calculate distances with row-major data without indexer.\n");
        goto LAB_002ddc36;
      }
    }
    else if (indexer != (TreesIndexer *)0x0) goto LAB_002dd751;
    indexer = (TreesIndexer *)0x0;
    bVar6 = 0;
  }
  local_90.is_col_major = false;
  local_90.ncols_numeric = 0;
  local_90.ncols_categ = 0;
  local_90.Xr_indptr = (unsigned_long *)0x0;
  pEVar5 = model_outputs_ext;
  if (model_outputs != (IsoForest *)0x0) {
    pEVar5 = (ExtIsoForest *)model_outputs;
  }
  local_90.Xr = (float *)0x0;
  local_90.Xr_ind = (unsigned_long *)0x0;
  lVar4 = (long)(pEVar5->hplanes).
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pEVar5->hplanes).
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  ntrees = lVar4 / 0x18;
  n_from_00 = 0;
  if (tmat == (double *)0x0) {
    n_from_00 = n_from;
  }
  local_90.numeric_data = numeric_data;
  local_90.categ_data = categ_data;
  local_90.nrows = nrows;
  local_90.Xc = Xc;
  local_90.Xc_ind = Xc_ind;
  local_90.Xc_indptr = Xc_indptr;
  if (nrows < 0xffffffff || n_from_00 != 0) {
    std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::vector
              (&worker_memory,1,(allocator_type *)&ss);
    SignalSwitcher::SignalSwitcher(&ss);
    check_interrupt_switch(&ss);
    ex._M_exception_object = (void *)0x0;
    if (((bVar6 & use_indexed_references) == 1 && tmat == (double *)0x0) &&
       (pSVar1 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pSVar1 != (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      puVar2 = (pSVar1->reference_points).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (pSVar1->reference_points).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((puVar2 != puVar3) &&
         ((as_kernel ||
          ((pSVar1->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (pSVar1->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish)))) {
        n_from_00 = (long)puVar3 - (long)puVar2 >> 3;
      }
    }
    if (model_outputs != (IsoForest *)0x0) {
      lVar4 = 0;
      sVar7 = ntrees;
      while (bVar8 = sVar7 != 0, sVar7 = sVar7 - 1, bVar8) {
        if (interrupt_switch == false) {
          initialize_worker_for_sim<PredictionData<float,unsigned_long>>
                    (worker_memory.
                     super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_90,model_outputs,
                     (ExtIsoForest *)0x0,n_from_00,assume_full_distr);
          traverse_tree_sim<PredictionData<float,unsigned_long>,double>
                    (worker_memory.
                     super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_90,model_outputs,
                     (vector<IsoTree,_std::allocator<IsoTree>_> *)
                     ((long)&(((model_outputs->trees).
                               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl + lVar4)
                     ,0,as_kernel);
        }
        lVar4 = lVar4 + 0x18;
      }
    }
    else {
      lVar4 = 0;
      sVar7 = ntrees;
      while (bVar8 = sVar7 != 0, sVar7 = sVar7 - 1, bVar8) {
        if (interrupt_switch == false) {
          initialize_worker_for_sim<PredictionData<float,unsigned_long>>
                    (worker_memory.
                     super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_90,(IsoForest *)0x0,
                     model_outputs_ext,n_from_00,assume_full_distr);
          traverse_hplane_sim<PredictionData<float,unsigned_long>,double>
                    (worker_memory.
                     super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_90,model_outputs_ext,
                     (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                     ((long)&(((model_outputs_ext->hplanes).
                               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl +
                     lVar4),0,as_kernel);
        }
        lVar4 = lVar4 + 0x18;
      }
    }
    check_interrupt_switch(&ss);
    gather_sim_result<PredictionData<float,unsigned_long>,InputData<float,unsigned_long>,WorkerMemory<ImputedData<unsigned_long,double>,double,float>>
              (&worker_memory,
               (vector<WorkerMemory<ImputedData<unsigned_long,_double>,_double,_float>,_std::allocator<WorkerMemory<ImputedData<unsigned_long,_double>,_double,_float>_>_>
                *)0x0,&local_90,(InputData<float,_unsigned_long> *)0x0,model_outputs,
               model_outputs_ext,tmat,rmat,n_from_00,ntrees,assume_full_distr,standardize_dist,
               as_kernel,1);
    check_interrupt_switch(&ss);
    std::__exception_ptr::exception_ptr::~exception_ptr(&ex);
    SignalSwitcher::~SignalSwitcher(&ss);
    std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::~vector(&worker_memory);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10,model_outputs,lVar4 % 0x18);
  std::runtime_error::runtime_error
            (this,"Number of rows implies too large distance matrix (integer overflow).");
LAB_002ddc36:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void calc_similarity_internal(
                     real_t numeric_data[], int categ_data[],
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     size_t nrows, int nthreads,
                     bool assume_full_distr, bool standardize_dist, bool as_kernel,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double tmat[], double rmat[], size_t n_from, bool use_indexed_references,
                     TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ)
{
    if (nrows < 2 && (!use_indexed_references || indexer == NULL || indexer->indices.empty() || indexer->indices.front().reference_points.empty()))
        throw std::runtime_error("Cannot calculate distances from less than 2 rows.\n");
    if (as_kernel && (tmat != NULL || !use_indexed_references || (indexer != NULL && !indexer->indices.empty() && indexer->indices.front().reference_points.empty())))
        indexer = NULL;

    if (indexer != NULL && model_outputs != NULL)
    {
        if (model_outputs->missing_action == Divide) {
            indexer = NULL;
            if (use_indexed_references) throw std::runtime_error("Invalid indexer - cannot use references from it.\n");
        }
        if (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && categ_data != NULL) {
            indexer = NULL;
            if (use_indexed_references) throw std::runtime_error("Invalid indexer - cannot use references from it.\n");
        }
    }
    if (
        !as_kernel &&
        indexer != NULL &&
        (indexer->indices.empty() || indexer->indices.front().node_distances.empty())
    ) {
        if (use_indexed_references && !indexer->indices.empty() && !indexer->indices.front().reference_points.empty())
            throw std::runtime_error("Indexer was built without distances. Cannot use references from it.\n");
        else {
            indexer = NULL;
            print_errmsg("Indexer has no pre-computed distances, will not be used for distance calculations.\n");
        }
    }
    if (
        !is_col_major &&
        indexer == NULL &&
        (
            Xc_indptr != NULL
                ||
            (nrows != 1 &&
             ((numeric_data != NULL && ld_numeric > 1) || (categ_data != NULL && ld_categ > 1)))
        )
    )
        throw std::runtime_error("Cannot calculate distances with row-major data without indexer.\n");
    if (indexer != NULL)
    {
        if (use_indexed_references && tmat == NULL && !indexer->indices.empty() && !indexer->indices.front().reference_points.empty())
        {
            if (unlikely(!assume_full_distr))
                throw std::runtime_error("Cannot calculate distances to reference points in indexer with 'assume_full_distr=false'.\n");
            
            if (!as_kernel)
            {
                calc_similarity_from_indexer_with_references(
                    numeric_data, categ_data,
                    Xc, Xc_ind, Xc_indptr,
                    nrows, nthreads, standardize_dist,
                    model_outputs, model_outputs_ext,
                    rmat,
                    indexer, is_col_major, ld_numeric, ld_categ
                );
            }
            
            else
            {
                kernel_to_references(*indexer,
                                     model_outputs, model_outputs_ext,
                                     numeric_data, categ_data,
                                     Xc, Xc_ind, Xc_indptr,
                                     is_col_major, ld_numeric, ld_categ,
                                     nrows, nthreads,
                                     rmat,
                                     standardize_dist);
            }
        }

        else
        {
            if (as_kernel) goto skip_indexer_if_kernel;
            calc_similarity_from_indexer(
                numeric_data, categ_data,
                Xc, Xc_ind, Xc_indptr,
                nrows, nthreads, assume_full_distr, standardize_dist,
                model_outputs, model_outputs_ext,
                tmat, rmat, n_from,
                indexer, is_col_major, ld_numeric, ld_categ
            );
        }

        return;
    }
    skip_indexer_if_kernel:

    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      false, 0, 0,
                                      Xc, Xc_ind, Xc_indptr,
                                      NULL, NULL, NULL};

    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();

    if (tmat != NULL) n_from = 0;

    if (n_from == 0) {
        #if SIZE_MAX == UINT32_MAX
        size_t lim_rows = (size_t)UINT16_MAX - (size_t)1;
        #elif SIZE_MAX == UINT64_MAX
        size_t lim_rows = (size_t)UINT32_MAX - (size_t)1;
        #else
        size_t lim_rows = (size_t)std::ceil(std::sqrt((ldouble_safe)SIZE_MAX));
        #endif
        if (nrows > lim_rows)
            throw std::runtime_error("Number of rows implies too large distance matrix (integer overflow).");
    }

    if ((size_t)nthreads > ntrees)
        nthreads = (int)ntrees;
    #ifdef _OPENMP
    std::vector<WorkerForSimilarity> worker_memory(nthreads);
    #else
    std::vector<WorkerForSimilarity> worker_memory(1);
    nthreads = 1;
    #endif

    /* Global variable that determines if the procedure receives a stop signal */
    SignalSwitcher ss = SignalSwitcher();
    check_interrupt_switch(ss);
    #if defined(DONT_THROW_ON_INTERRUPT)
    if (interrupt_switch) return;
    #endif
    /* For handling exceptions */
    bool threw_exception = false;
    std::exception_ptr ex = NULL;

    if (
        tmat == NULL &&
        use_indexed_references &&
        indexer != NULL &&
        !indexer->indices.empty() &&
        !indexer->indices.front().reference_points.empty() &&
        (as_kernel || !indexer->indices.front().node_distances.empty())
    ) {
        n_from = indexer->indices.front().reference_points.size();
    }

    if (model_outputs != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(ntrees, worker_memory, prediction_data, model_outputs, ex, threw_exception, n_from)
        for (size_t_for tree = 0; tree < (decltype(tree))ntrees; tree++)
        {
            if (threw_exception || interrupt_switch) continue;
            try
            {
                initialize_worker_for_sim(worker_memory[omp_get_thread_num()], prediction_data,
                                          model_outputs, NULL, n_from, assume_full_distr);
                traverse_tree_sim<PredictionData<real_t, sparse_ix>, ldouble_safe>(
                                  worker_memory[omp_get_thread_num()],
                                  prediction_data,
                                  *model_outputs,
                                  model_outputs->trees[tree],
                                  (size_t)0,
                                  as_kernel);
            }

            catch (...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }
        }
    }

    else
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(ntrees, worker_memory, prediction_data, model_outputs_ext, ex, threw_exception, n_from)
        for (size_t_for hplane = 0; hplane < (decltype(hplane))ntrees; hplane++)
        {
            if (threw_exception || interrupt_switch) continue;
            try
            {
                initialize_worker_for_sim(worker_memory[omp_get_thread_num()], prediction_data,
                                          NULL, model_outputs_ext, n_from, assume_full_distr);
                traverse_hplane_sim<PredictionData<real_t, sparse_ix>, ldouble_safe>(
                                    worker_memory[omp_get_thread_num()],
                                    prediction_data,
                                    *model_outputs_ext,
                                    model_outputs_ext->hplanes[hplane],
                                    (size_t)0,
                                    as_kernel);
            }

            catch (...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }
        }    
    }

    check_interrupt_switch(ss);
    #if defined(DONT_THROW_ON_INTERRUPT)
    if (interrupt_switch) return;
    #endif

    if (threw_exception)
        std::rethrow_exception(ex);
    
    /* gather and transform the results */
    gather_sim_result< PredictionData<real_t, sparse_ix>,
                       InputData<real_t, sparse_ix>,
                       WorkerMemory<ImputedData<sparse_ix, ldouble_safe>, ldouble_safe, real_t> >
                     (&worker_memory, NULL,
                      &prediction_data, NULL,
                      model_outputs, model_outputs_ext,
                      tmat, rmat, n_from,
                      ntrees, assume_full_distr,
                      standardize_dist, as_kernel, nthreads);

    check_interrupt_switch(ss);
    #if defined(DONT_THROW_ON_INTERRUPT)
    if (interrupt_switch) return;
    #endif
}